

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryLeakWarningTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_MemoryLeakWarningTest_LeakWarningWithPluginDisabled_TestShell::createTest
          (TEST_MemoryLeakWarningTest_LeakWarningWithPluginDisabled_TestShell *this)

{
  TEST_MemoryLeakWarningTest_LeakWarningWithPluginDisabled_Test *this_00;
  
  this_00 = (TEST_MemoryLeakWarningTest_LeakWarningWithPluginDisabled_Test *)
            operator_new(0x18,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/MemoryLeakWarningTest.cpp"
                         ,0x89);
  TEST_MemoryLeakWarningTest_LeakWarningWithPluginDisabled_Test::
  TEST_MemoryLeakWarningTest_LeakWarningWithPluginDisabled_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(MemoryLeakWarningTest, LeakWarningWithPluginDisabled)
{
    fixture->setTestFunction(testLeakWarningWithPluginDisabled_);

    MemoryLeakWarningPlugin::saveAndDisableNewDeleteOverloads();

    fixture->runAllTests();

    LONGS_EQUAL(0, fixture->getFailureCount());
    fixture->assertPrintContains("Warning: Expected 1 leak(s), but leak detection was disabled");

    cpputest_free_location_with_leak_detection(leak1, __FILE__, __LINE__);
    leak1 = NULLPTR;

    MemoryLeakWarningPlugin::restoreNewDeleteOverloads();
}